

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterBase.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::ssc::SscWriterBase::SyncMpiPattern(SscWriterBase *this,MPI_Comm comm)

{
  undefined8 in_RSI;
  long in_RDI;
  MPI_Group *in_stack_00000010;
  MPI_Group *in_stack_00000018;
  MPI_Comm in_stack_00000020;
  int in_stack_00000028;
  char in_stack_0000002f;
  string *in_stack_00000030;
  int readerMasterStreamRank;
  int writerMasterStreamRank;
  MPI_Comm readerComm;
  MPI_Group writerGroup;
  MPI_Group streamGroup;
  undefined4 local_40;
  undefined4 local_3c [7];
  undefined8 local_20;
  
  local_20 = in_RSI;
  helper::HandshakeComm
            (in_stack_00000030,in_stack_0000002f,in_stack_00000028,in_stack_00000020,
             in_stack_00000018,in_stack_00000010,(MPI_Group *)readerComm,(MPI_Comm *)writerGroup,
             (MPI_Comm *)streamGroup,(MPI_Comm *)comm,(int)this);
  MPI_Comm_rank(local_20,in_RDI + 0x28);
  MPI_Comm_size(local_20,in_RDI + 0x2c);
  MPI_Comm_rank(*(undefined8 *)(in_RDI + 0x10),in_RDI + 0x20);
  MPI_Comm_size(*(undefined8 *)(in_RDI + 0x10),in_RDI + 0x24);
  local_3c[0] = 0xffffffff;
  if (*(int *)(in_RDI + 0x28) == 0) {
    local_3c[0] = *(undefined4 *)(in_RDI + 0x20);
  }
  MPI_Allreduce(local_3c,in_RDI + 0x30,1,&ompi_mpi_int,&ompi_mpi_op_max,
                *(undefined8 *)(in_RDI + 0x10));
  local_40 = 0xffffffff;
  MPI_Allreduce(&local_40,in_RDI + 0x34,1,&ompi_mpi_int,&ompi_mpi_op_max,
                *(undefined8 *)(in_RDI + 0x10));
  return;
}

Assistant:

void SscWriterBase::SyncMpiPattern(MPI_Comm comm)
{
    MPI_Group streamGroup;
    MPI_Group writerGroup;
    MPI_Comm readerComm;

    helper::HandshakeComm(m_Name, 'w', m_OpenTimeoutSecs, comm, streamGroup, writerGroup,
                          m_ReaderGroup, m_StreamComm, m_WriterComm, readerComm, m_Verbosity);

    MPI_Comm_rank(comm, &m_WriterRank);
    MPI_Comm_size(comm, &m_WriterSize);

    MPI_Comm_rank(m_StreamComm, &m_StreamRank);
    MPI_Comm_size(m_StreamComm, &m_StreamSize);

    int writerMasterStreamRank = -1;
    if (m_WriterRank == 0)
    {
        writerMasterStreamRank = m_StreamRank;
    }
    MPI_Allreduce(&writerMasterStreamRank, &m_WriterMasterStreamRank, 1, MPI_INT, MPI_MAX,
                  m_StreamComm);

    int readerMasterStreamRank = -1;
    MPI_Allreduce(&readerMasterStreamRank, &m_ReaderMasterStreamRank, 1, MPI_INT, MPI_MAX,
                  m_StreamComm);
}